

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O0

void __thiscall tst_helpers_connect::rejectOneSenderDestroyed(tst_helpers_connect *this)

{
  bool bVar1;
  Object *this_00;
  bool local_5a;
  bool local_59 [7];
  bool local_52;
  bool local_51;
  code *local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  PromiseFromSignal<void_(Object::*)(int,_const_QString_&)> p;
  undefined1 local_18 [8];
  Object *sender;
  tst_helpers_connect *this_local;
  
  sender = (Object *)this;
  this_00 = (Object *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)&this_00->field_0x8 = 0;
  *(undefined8 *)&this_00->m_connections = 0;
  Object::Object(this_00);
  p.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)local_18;
  local_18 = (undefined1  [8])this_00;
  QtPromisePrivate::qtpromise_defer<tst_helpers_connect::rejectOneSenderDestroyed()::__0>
            ((type *)&p.super_QPromiseBase<int>.m_d);
  local_50 = Object::twoArgsSignal;
  local_48 = 0;
  QtPromise::connect<Object,void(Object::*)(int,QString_const&)>
            ((Object *)local_40,(offset_in_Object_to_subr)local_18);
  local_51 = QtPromise::QPromiseBase<int>::isPending((QPromiseBase<int> *)local_40);
  local_52 = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_51,&local_52,"p.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0x8b);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_59[0] = waitForRejected<QtPromise::QPromiseContextException,QtPromise::QPromise<int>>
                            ((QPromise<int> *)local_40);
    local_5a = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_59,&local_5a,"waitForRejected<QtPromise::QPromiseContextException>(p)",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                       ,0x8c);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_59[1] = false;
      local_59[2] = false;
      local_59[3] = false;
      local_59[4] = false;
    }
    else {
      local_59[1] = true;
      local_59[2] = false;
      local_59[3] = false;
      local_59[4] = false;
    }
  }
  else {
    local_59[1] = true;
    local_59[2] = false;
    local_59[3] = false;
    local_59[4] = false;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_40);
  return;
}

Assistant:

void tst_helpers_connect::rejectOneSenderDestroyed()
{
    auto sender = new Object{};
    QtPromisePrivate::qtpromise_defer([&]() {
        sender->deleteLater();
    });

    auto p = QtPromise::connect(sender, &Object::twoArgsSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForRejected<QtPromise::QPromiseContextException>(p), true);
}